

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap_TEST.cpp
# Opt level: O0

void __thiscall
Valid_test_case_Heap_Heap_unit_test_Test::~Valid_test_case_Heap_Heap_unit_test_Test
          (Valid_test_case_Heap_Heap_unit_test_Test *this)

{
  Valid_test_case_Heap_Heap_unit_test_Test *this_local;
  
  ~Valid_test_case_Heap_Heap_unit_test_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(Valid_test_case_Heap, Heap_unit_test) {
    //max heap
    Heap<int> heap(greater);
    heap.push(1);
    heap.push(2);
    heap.push(5);
    heap.push(6);
    heap.push(9);
    heap.push(0);

    ASSERT_EQ(9, heap.top());

    //Min heap
    Heap<int> heap1(less);
    heap1.push(1);
    heap1.push(2);
    heap1.push(5);
    heap1.push(6);
    heap1.push(9);
    heap1.push(0);

    ASSERT_EQ(0, heap1.top());
}